

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::make_next_equality_node
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  pointer *ppnVar1;
  uint uVar2;
  pointer pnVar3;
  pointer pcVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *pvVar7;
  uint uVar8;
  ptrdiff_t _Num;
  ulong __n;
  pointer piVar9;
  uint level;
  uint local_24;
  int local_20;
  float local_1c;
  
  pnVar3 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = pnVar3[-1].level;
  local_24 = uVar8 + 1;
  uVar2 = (this->subvector).m_element_size;
  if (local_24 < uVar2) {
    pnVar3[-1].level = local_24;
    uVar8 = uVar8 + 2;
    local_1c = pnVar3[-1].sumr;
    pnVar3[-1].z = local_1c;
    if (uVar8 < uVar2) {
      piVar9 = (this->items).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar3[-1].z = local_1c + piVar9[uVar8].sum_z;
    }
    else {
      piVar9 = (this->items).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar8 = pnVar3[-1].variables;
    local_1c = local_1c + piVar9[local_24].r;
    local_20 = pnVar3[-1].sumfactor + piVar9[local_24].factor;
    pvVar6 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
             ::emplace_back<float,int,unsigned_int_const&>
                       ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
                         *)&this->nodes,&local_1c,&local_20,&local_24);
    sVar5 = shared_subvector::emplace(&this->subvector);
    pvVar6->variables = sVar5;
    __n = (ulong)(this->subvector).m_element_size;
    if (__n != 0) {
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar4 + sVar5,pcVar4 + uVar8,__n);
      sVar5 = pvVar6->variables;
    }
    pvVar7 = shared_subvector::operator[](&this->subvector,sVar5 + local_24);
    *pvVar7 = '\x01';
    uVar2 = (this->subvector).m_element_size;
    if (local_24 + 1 < uVar2) {
      pvVar6->z = pvVar6->sumr +
                  (this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_24 + 1].sum_z;
    }
    if (pvVar6->sumfactor != this->b_min) {
      return;
    }
    if (pvVar6->sumr < this->lower_bound) {
      if ((ulong)uVar2 != 0) {
        pcVar4 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar4 + this->solution,pcVar4 + uVar8,(ulong)uVar2);
      }
      uVar8 = local_24 + this->solution;
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4[uVar8] = pcVar4[uVar8] == '\0';
      this->lower_bound =
           (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].sumr;
    }
    uVar8 = pvVar6->variables;
  }
  else {
    uVar8 = pnVar3[-1].variables;
  }
  shared_subvector::remove(&this->subvector,(char *)(ulong)uVar8);
  ppnVar1 = &(this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppnVar1 = *ppnVar1 + -1;
  return;
}

Assistant:

void make_next_equality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (node_1.sumfactor == b_min) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }